

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O0

void Cmd_writewave(FCommandLine *argv,APlayerPawn *who,int key)

{
  MusInfo *pMVar1;
  int iVar2;
  char *pcVar3;
  char *__nptr;
  long *plVar4;
  uint local_3c;
  MusInfo *dumper;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  undefined4 extraout_var;
  
  iVar2 = FCommandLine::argc(argv);
  if ((iVar2 < 2) || (iVar2 = FCommandLine::argc(argv), pMVar1 = currSong, 3 < iVar2)) {
    Printf("Usage: writewave <filename> [sample rate]");
  }
  else if (currSong == (MusInfo *)0x0) {
    Printf("No song is currently playing.\n");
  }
  else {
    pcVar3 = FCommandLine::operator[](argv,1);
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 == 3) {
      __nptr = FCommandLine::operator[](argv,2);
      local_3c = atoi(__nptr);
    }
    else {
      local_3c = 0;
    }
    iVar2 = (*pMVar1->_vptr_MusInfo[0x10])(pMVar1,pcVar3,(ulong)local_3c);
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar4 == (long *)0x0) {
      Printf("Current song cannot be saved as wave data.\n");
    }
    else {
      (**(code **)(*plVar4 + 0x20))(plVar4,0);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
  }
  return;
}

Assistant:

CCMD (writewave)
{
	if (argv.argc() >= 2 && argv.argc() <= 3)
	{
		if (currSong == NULL)
		{
			Printf ("No song is currently playing.\n");
		}
		else
		{
			MusInfo *dumper = currSong->GetWaveDumper(argv[1], argv.argc() == 3 ? atoi(argv[2]) : 0);
			if (dumper == NULL)
			{
				Printf ("Current song cannot be saved as wave data.\n");
			}
			else
			{
				dumper->Play(false, 0);		// FIXME: Remember subsong
				delete dumper;
			}
		}
	}
	else
	{
		Printf ("Usage: writewave <filename> [sample rate]");
	}
}